

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

string * backward::TraceResolverLinuxBase::read_symlink(string *symlink_path)

{
  char *__path;
  reference __buf;
  size_t __len;
  ssize_t sVar1;
  long lVar2;
  string *in_RDI;
  ssize_t len;
  string path;
  allocator local_51;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  ssize_t local_48;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::resize((ulong)local_30);
  do {
    __path = (char *)std::__cxx11::string::c_str();
    local_50._M_current = (char *)std::__cxx11::string::begin();
    __buf = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_50);
    __len = std::__cxx11::string::size();
    sVar1 = readlink(__path,__buf,__len);
    local_48 = sVar1;
    if (sVar1 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"",&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
LAB_001131a0:
      std::__cxx11::string::~string(local_30);
      return in_RDI;
    }
    lVar2 = std::__cxx11::string::size();
    if (sVar1 != lVar2) {
      std::__cxx11::string::resize((ulong)local_30);
      std::__cxx11::string::string(in_RDI,local_30);
      goto LAB_001131a0;
    }
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)local_30);
  } while( true );
}

Assistant:

static std::string read_symlink(std::string const &symlink_path) {
    std::string path;
    path.resize(100);

    while (true) {
      ssize_t len =
          ::readlink(symlink_path.c_str(), &*path.begin(), path.size());
      if (len < 0) {
        return "";
      }
      if (static_cast<size_t>(len) == path.size()) {
        path.resize(path.size() * 2);
      } else {
        path.resize(static_cast<std::string::size_type>(len));
        break;
      }
    }

    return path;
  }